

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void shiftConstraints(QList<QSimplexConstraint_*> *constraints,qreal amount)

{
  Data *pDVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long in_RSI;
  ulong uVar6;
  long lVar7;
  double dVar8;
  
  if (in_RSI != 0) {
    lVar4 = 0;
    do {
      pDVar1 = (&(constraints->d).d)[lVar4];
      lVar5 = *(long *)&pDVar1->super_QArrayData;
      if (lVar5 == 0) {
LAB_005c20dc:
        lVar5 = 0;
        uVar6 = 0;
LAB_005c20e1:
        dVar8 = 0.0;
        if (lVar5 != 0 || uVar6 != 0) goto LAB_005c20ed;
      }
      else {
        if (**(char **)(lVar5 + 0x20) == -1) {
          uVar3 = 1;
          do {
            uVar6 = uVar3;
            if (*(ulong *)(lVar5 + 0x10) == uVar6) goto LAB_005c20dc;
            uVar3 = uVar6 + 1;
          } while ((*(char **)(lVar5 + 0x20))[(ulong)((uint)uVar6 & 0x7f) + (uVar6 >> 7) * 0x90] ==
                   -1);
          goto LAB_005c20e1;
        }
        uVar6 = 0;
LAB_005c20ed:
        dVar8 = 0.0;
        do {
          lVar2 = *(long *)(lVar5 + 0x20);
          lVar7 = (uVar6 >> 7) * 0x90;
          dVar8 = dVar8 + *(double *)
                           (*(long *)(lVar2 + 0x80 + lVar7) + 8 +
                           (ulong)*(byte *)((ulong)((uint)uVar6 & 0x7f) + lVar2 + lVar7) * 0x10);
          do {
            if (*(long *)(lVar5 + 0x10) - 1U == uVar6) {
              uVar6 = 0;
              lVar5 = 0;
              break;
            }
            uVar6 = uVar6 + 1;
          } while (*(char *)((ulong)((uint)uVar6 & 0x7f) + (uVar6 >> 7) * 0x90 + lVar2) == -1);
        } while ((uVar6 != 0) || (lVar5 != 0));
      }
      (pDVar1->super_QArrayData).alloc =
           (qsizetype)(dVar8 * amount + (double)(pDVar1->super_QArrayData).alloc);
      lVar4 = lVar4 + 1;
    } while (lVar4 != in_RSI);
  }
  return;
}

Assistant:

static void shiftConstraints(const QList<QSimplexConstraint *> &constraints, qreal amount)
{
    for (int i = 0; i < constraints.size(); ++i) {
        QSimplexConstraint *c = constraints.at(i);
        const qreal multiplier = std::accumulate(c->variables.cbegin(), c->variables.cend(), qreal(0));
        c->constant += multiplier * amount;
    }
}